

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.hpp
# Opt level: O3

void __thiscall
helics::EndpointInfo::EndpointInfo
          (EndpointInfo *this,GlobalHandle handle,string_view key_,string_view type_)

{
  this->id = handle;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,key_._M_str,key_._M_str + key_._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,type_._M_str,type_._M_str + type_._M_len);
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->message_queue).m_obj.
  super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::_M_initialize_map((_Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                       *)&this->message_queue,0);
  *(undefined8 *)((long)&(this->message_queue).m_mutex._M_impl._M_rwlock.__data.__pad2 + 4) = 0;
  *(undefined8 *)((long)&(this->message_queue).m_mutex._M_impl._M_rwlock + 0x34) = 0;
  *(undefined8 *)((long)&(this->message_queue).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->message_queue).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->message_queue).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->message_queue).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  (this->message_queue).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->message_queue).m_mutex._M_impl._M_rwlock + 8) = 0;
  (this->sourceInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->targetInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->targetInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->targetInformation).
  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->targets).
  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->targets).
  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->targets).
  super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sourceTargets)._M_dataplus._M_p = (pointer)&(this->sourceTargets).field_2;
  (this->sourceTargets)._M_string_length = 0;
  (this->sourceTargets).field_2._M_local_buf[0] = '\0';
  (this->destinationTargets)._M_dataplus._M_p = (pointer)&(this->destinationTargets).field_2;
  (this->destinationTargets)._M_string_length = 0;
  (this->destinationTargets).field_2._M_local_buf[0] = '\0';
  this->requiredConnections = 0;
  this->hasFilter = false;
  this->required = false;
  this->targetedEndpoint = false;
  this->sourceOnly = false;
  this->receiveOnly = false;
  return;
}

Assistant:

EndpointInfo(GlobalHandle handle, std::string_view key_, std::string_view type_):
        id(handle), key(key_), type(type_)
    {
    }